

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gogoing_util.cpp
# Opt level: O2

void going_set_off_tcp_cork(int sockfd)

{
  FILE *__stream;
  int iVar1;
  int *piVar2;
  char *pcVar3;
  int off;
  
  off = 0;
  iVar1 = setsockopt(sockfd,6,3,&off,4);
  __stream = _stderr;
  if (-1 < iVar1) {
    return;
  }
  piVar2 = __errno_location();
  if (*piVar2 == 0) {
    pcVar3 = "None";
  }
  else {
    pcVar3 = strerror(*piVar2);
  }
  fprintf(__stream,"[ERROR] (%s:%d: errno: %s) setsockopt: TCP_CORK OFF failed.\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/tangwz[P]Gogoing/src/Gogoing_util.cpp"
          ,0x13f,pcVar3);
  exit(-1);
}

Assistant:

void going_set_off_tcp_cork(int sockfd)
 {
 	int off = 0;
 	int ret = setsockopt(sockfd, SOL_TCP, TCP_CORK, &off, sizeof(off));
 	if(ret < 0){
 		log_err("setsockopt: TCP_CORK OFF failed.");
		exit(-1);
 	}
 }